

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsaes_oaep_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,uchar *label,size_t label_len,size_t *olen,uchar *input,uchar *output,
              size_t output_max_len)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  long lVar4;
  long lVar5;
  byte *__n;
  byte *src;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong dlen;
  uchar lhash [64];
  uchar buf [1024];
  mbedtls_md_context_t local_490;
  byte local_478 [64];
  byte local_438 [1032];
  
  if ((mode != 1) || (iVar3 = -0x4080, ctx->padding == 1)) {
    sVar1 = ctx->len;
    iVar3 = -0x4080;
    if (0xfffffffffffffc0e < sVar1 - 0x401) {
      md_info = mbedtls_md_info_from_type(ctx->hash_id);
      if (md_info != (mbedtls_md_info_t *)0x0) {
        if (mode == 0) {
          iVar3 = mbedtls_rsa_public(ctx,input,local_438);
        }
        else {
          iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,local_438);
        }
        if (iVar3 == 0) {
          bVar2 = mbedtls_md_get_size(md_info);
          dlen = (ulong)bVar2;
          mbedtls_md_init(&local_490);
          uVar6 = 0;
          mbedtls_md_setup(&local_490,md_info,0);
          mbedtls_md(md_info,label,label_len,local_478);
          src = local_438 + dlen + 1;
          mgf_mask(local_438 + 1,dlen,src,~dlen + sVar1,&local_490);
          mgf_mask(src,~dlen + sVar1,local_438 + 1,dlen,&local_490);
          mbedtls_md_free(&local_490);
          if (bVar2 != 0) {
            uVar6 = (ulong)((uint)bVar2 + (uint)bVar2);
            uVar8 = 0;
            do {
              local_438[0] = local_438[0] | src[uVar8] ^ local_478[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar8 != dlen);
            src = local_438 + uVar6 + 1;
          }
          uVar7 = 0;
          lVar5 = (sVar1 - 2) - uVar6;
          if (lVar5 == 0) {
            lVar4 = 0;
          }
          else {
            lVar9 = 0;
            lVar4 = 0;
            do {
              uVar7 = uVar7 | local_438[lVar9 + dlen * 2 + 1];
              lVar4 = lVar4 + (ulong)((-uVar7 & 0xff | uVar7) >> 7 ^ 1);
              lVar9 = lVar9 + 1;
            } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
          }
          iVar3 = -0x4100;
          if (src[lVar4] == 1 && local_438[0] == 0) {
            __n = local_438 + (sVar1 - (long)(src + lVar4 + 1));
            iVar3 = -0x4400;
            if (__n <= output_max_len) {
              *olen = (size_t)__n;
              memcpy(output,src + lVar4 + 1,(size_t)__n);
              iVar3 = 0;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_oaep_decrypt( mbedtls_rsa_context *ctx,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng,
                            int mode,
                            const unsigned char *label, size_t label_len,
                            size_t *olen,
                            const unsigned char *input,
                            unsigned char *output,
                            size_t output_max_len )
{
    int ret;
    size_t ilen, i, pad_len;
    unsigned char *p, bad, pad_done;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char lhash[MBEDTLS_MD_MAX_SIZE];
    unsigned int hlen;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    /*
     * Parameters sanity checks
     */
    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * RSA operation
     */
    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        return( ret );

    /*
     * Unmask data and generate lHash
     */
    hlen = mbedtls_md_get_size( md_info );

    mbedtls_md_init( &md_ctx );
    mbedtls_md_setup( &md_ctx, md_info, 0 );

    /* Generate lHash */
    mbedtls_md( md_info, label, label_len, lhash );

    /* seed: Apply seedMask to maskedSeed */
    mgf_mask( buf + 1, hlen, buf + hlen + 1, ilen - hlen - 1,
               &md_ctx );

    /* DB: Apply dbMask to maskedDB */
    mgf_mask( buf + hlen + 1, ilen - hlen - 1, buf + 1, hlen,
               &md_ctx );

    mbedtls_md_free( &md_ctx );

    /*
     * Check contents, in "constant-time"
     */
    p = buf;
    bad = 0;

    bad |= *p++; /* First byte must be 0 */

    p += hlen; /* Skip seed */

    /* Check lHash */
    for( i = 0; i < hlen; i++ )
        bad |= lhash[i] ^ *p++;

    /* Get zero-padding len, but always read till end of buffer
     * (minus one, for the 01 byte) */
    pad_len = 0;
    pad_done = 0;
    for( i = 0; i < ilen - 2 * hlen - 2; i++ )
    {
        pad_done |= p[i];
        pad_len += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
    }

    p += pad_len;
    bad |= *p++ ^ 0x01;

    /*
     * The only information "leaked" is whether the padding was correct or not
     * (eg, no data is copied if it was not correct). This meets the
     * recommendations in PKCS#1 v2.2: an opponent cannot distinguish between
     * the different error conditions.
     */
    if( bad != 0 )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( ilen - ( p - buf ) > output_max_len )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );

    return( 0 );
}